

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QMap<int,_QVariant>_>::end(QList<QMap<int,_QVariant>_> *this)

{
  QMap<int,_QVariant> *n;
  QArrayDataPointer<QMap<int,_QVariant>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QMap<int,_QVariant>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QMap<int,_QVariant>_> *)0x820ed9);
  QArrayDataPointer<QMap<int,_QVariant>_>::operator->(in_RDI);
  n = QArrayDataPointer<QMap<int,_QVariant>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }